

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemmodel.cpp
# Opt level: O2

void QAbstractItemModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_24_3_e3d07ef4_for_data *paVar9;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  LayoutChangeHint LVar10;
  int column;
  void *pvVar11;
  void *pvVar12;
  undefined4 in_register_00000034;
  QList<QPersistentModelIndex> *pQVar13;
  _func_int **pp_Var14;
  long in_FS_OFFSET;
  undefined4 uVar15;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 0) {
      puVar6 = (undefined8 *)*_a;
      if (*_a[1] == 2) {
        *puVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
        goto switchD_003f3c48_default;
      }
    }
    else {
      puVar6 = (undefined8 *)*_a;
    }
    *puVar6 = 0;
    goto switchD_003f3c48_default;
  }
  if (_c == IndexOfMethod) {
    bVar3 = QtMocHelpers::
            indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&)>
                      ((QtMocHelpers *)_a,(void **)dataChanged,0,0);
    if (((((((!bVar3) &&
            (bVar3 = QtMocHelpers::
                     indexOfMethod<void(QAbstractItemModel::*)(Qt::Orientation,int,int)>
                               ((QtMocHelpers *)_a,(void **)headerDataChanged,0,2), !bVar3)) &&
           (bVar3 = QtMocHelpers::
                    indexOfMethod<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
                              ((QtMocHelpers *)_a,(void **)layoutChanged,0,3), !bVar3)) &&
          ((bVar3 = QtMocHelpers::
                    indexOfMethod<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
                              ((QtMocHelpers *)_a,(void **)layoutAboutToBeChanged,0,6), !bVar3 &&
           (bVar3 = QtMocHelpers::
                    indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                              ((QtMocHelpers *)_a,(void **)rowsAboutToBeInserted,0,9), !bVar3)))) &&
         ((bVar3 = QtMocHelpers::
                   indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                             ((QtMocHelpers *)_a,(void **)rowsInserted,0,10), !bVar3 &&
          ((bVar3 = QtMocHelpers::
                    indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                              ((QtMocHelpers *)_a,(void **)rowsAboutToBeRemoved,0,0xb), !bVar3 &&
           (bVar3 = QtMocHelpers::
                    indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                              ((QtMocHelpers *)_a,(void **)rowsRemoved,0,0xc), !bVar3)))))) &&
        (bVar3 = QtMocHelpers::
                 indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                           ((QtMocHelpers *)_a,(void **)columnsAboutToBeInserted,0,0xd), !bVar3)) &&
       ((((bVar3 = QtMocHelpers::
                   indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                             ((QtMocHelpers *)_a,(void **)columnsInserted,0,0xe), !bVar3 &&
          (bVar3 = QtMocHelpers::
                   indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                             ((QtMocHelpers *)_a,(void **)columnsAboutToBeRemoved,0,0xf), !bVar3))
         && (bVar3 = QtMocHelpers::
                     indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                               ((QtMocHelpers *)_a,(void **)columnsRemoved,0,0x10), !bVar3)) &&
        (((bVar3 = QtMocHelpers::
                   indexOfMethod<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal)>
                             ((QtMocHelpers *)_a,(void **)modelAboutToBeReset,0,0x11), !bVar3 &&
          (bVar3 = QtMocHelpers::
                   indexOfMethod<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal)>
                             ((QtMocHelpers *)_a,(void **)modelReset,0,0x12), !bVar3)) &&
         ((bVar3 = QtMocHelpers::
                   indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal)>
                             ((QtMocHelpers *)_a,(void **)rowsAboutToBeMoved,0,0x13), !bVar3 &&
          ((bVar3 = QtMocHelpers::
                    indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal)>
                              ((QtMocHelpers *)_a,(void **)rowsMoved,0,0x14), !bVar3 &&
           (bVar3 = QtMocHelpers::
                    indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal)>
                              ((QtMocHelpers *)_a,(void **)columnsAboutToBeMoved,0,0x15), !bVar3))))
         )))))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QtMocHelpers::
        indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal)>
                  ((QtMocHelpers *)_a,(void **)columnsMoved,0,0x16);
        return;
      }
      goto LAB_003f4a0b;
    }
    goto switchD_003f3c48_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_003f3c48_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      dataChanged((QAbstractItemModel *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2],
                  (QList<int> *)_a[3]);
      return;
    }
    break;
  case 1:
    local_38.shared = (PrivateShared *)0x0;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
    dataChanged((QAbstractItemModel *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2],
                (QList<int> *)&local_38);
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_38);
    goto switchD_003f3c48_default;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      headerDataChanged((QAbstractItemModel *)_o,*_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 3:
    pQVar13 = (QList<QPersistentModelIndex> *)_a[1];
    LVar10 = *_a[2];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
LAB_003f439d:
      layoutChanged((QAbstractItemModel *)_o,pQVar13,LVar10);
      return;
    }
    break;
  case 4:
    pQVar13 = (QList<QPersistentModelIndex> *)_a[1];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      LVar10 = NoLayoutChangeHint;
      goto LAB_003f439d;
    }
    break;
  case 5:
    local_38.shared = (PrivateShared *)0x0;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
    layoutChanged((QAbstractItemModel *)_o,(QList<QPersistentModelIndex> *)&local_38,
                  NoLayoutChangeHint);
    goto LAB_003f4627;
  case 6:
    pQVar13 = (QList<QPersistentModelIndex> *)_a[1];
    LVar10 = *_a[2];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
LAB_003f45b1:
      layoutAboutToBeChanged((QAbstractItemModel *)_o,pQVar13,LVar10);
      return;
    }
    break;
  case 7:
    pQVar13 = (QList<QPersistentModelIndex> *)_a[1];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      LVar10 = NoLayoutChangeHint;
      goto LAB_003f45b1;
    }
    break;
  case 8:
    local_38.shared = (PrivateShared *)0x0;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
    layoutAboutToBeChanged
              ((QAbstractItemModel *)_o,(QList<QPersistentModelIndex> *)&local_38,NoLayoutChangeHint
              );
LAB_003f4627:
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)&local_38);
    goto switchD_003f3c48_default;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      rowsAboutToBeInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      rowsInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      rowsAboutToBeRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      rowsRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      columnsAboutToBeInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xe:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      columnsInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      columnsAboutToBeRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0x10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      columnsRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0x11:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      modelAboutToBeReset((QAbstractItemModel *)_o);
      return;
    }
    break;
  case 0x12:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      modelReset((QAbstractItemModel *)_o);
      return;
    }
    break;
  case 0x13:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      rowsAboutToBeMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
      return;
    }
    break;
  case 0x14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      rowsMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
      return;
    }
    break;
  case 0x15:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      columnsAboutToBeMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
      return;
    }
    break;
  case 0x16:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      columnsMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
      return;
    }
    break;
  case 0x17:
    iVar5 = (*_o->_vptr_QObject[0x2e])(_o);
    uVar4 = (undefined1)iVar5;
    goto LAB_003f497d;
  case 0x18:
    UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x2f];
    goto LAB_003f42d0;
  case 0x19:
    UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x30];
LAB_003f42d0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      (*UNRECOVERED_JUMPTABLE_00)
                (_o,CONCAT44(in_register_00000034,_c),*(long *)(in_FS_OFFSET + 0x28),
                 UNRECOVERED_JUMPTABLE_00);
      return;
    }
    break;
  case 0x1a:
    iVar5 = *_a[1];
    column = *_a[2];
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[3];
    goto LAB_003f48ca;
  case 0x1b:
    iVar5 = *_a[1];
    column = *_a[2];
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f48ca:
    uVar4 = hasIndex((QAbstractItemModel *)_o,iVar5,column,(QModelIndex *)paVar9);
    goto LAB_003f497d;
  case 0x1c:
    uVar2 = *_a[1];
    uVar1 = *_a[2];
    puVar6 = (undefined8 *)_a[3];
    goto LAB_003f4843;
  case 0x1d:
    uVar2 = *_a[1];
    uVar1 = *_a[2];
    puVar6 = &local_50;
    local_50 = 0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
LAB_003f4843:
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0xc])(&local_38,_o,(ulong)uVar2,(ulong)uVar1,puVar6);
    goto LAB_003f484d;
  case 0x1e:
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0xd])(&local_38,_o,_a[1]);
    goto LAB_003f484d;
  case 0x1f:
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0xe])(&local_38,_o,(ulong)*_a[1],(ulong)*_a[2],_a[3]);
LAB_003f484d:
    puVar6 = (undefined8 *)*_a;
    if (puVar6 != (undefined8 *)0x0) {
      puVar6[2] = local_38._16_8_;
      *puVar6 = local_38.shared;
      puVar6[1] = local_38._8_8_;
    }
    goto switchD_003f3c48_default;
  case 0x20:
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[1];
    goto LAB_003f4669;
  case 0x21:
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f4669:
    iVar5 = (*_o->_vptr_QObject[0xf])(_o,paVar9);
LAB_003f4672:
    if ((int *)*_a != (int *)0x0) {
      *(int *)*_a = iVar5;
    }
    goto switchD_003f3c48_default;
  case 0x22:
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[1];
    goto LAB_003f40a0;
  case 0x23:
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f40a0:
    iVar5 = (*_o->_vptr_QObject[0x10])(_o,paVar9);
    goto LAB_003f4672;
  case 0x24:
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[1];
    goto LAB_003f4001;
  case 0x25:
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f4001:
    iVar5 = (*_o->_vptr_QObject[0x11])(_o,paVar9);
    uVar4 = (undefined1)iVar5;
    goto LAB_003f497d;
  case 0x26:
    pvVar12 = _a[1];
    uVar8 = (ulong)*_a[2];
    pp_Var14 = _o->_vptr_QObject;
    goto LAB_003f4892;
  case 0x27:
    pvVar12 = _a[1];
    pp_Var14 = _o->_vptr_QObject;
    uVar8 = 0;
LAB_003f4892:
    uStack_1c = 0xaaaaaaaa;
    uStack_20 = 0xaaaaaaaa;
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    (*pp_Var14[0x12])(&local_38,_o,pvVar12,uVar8);
LAB_003f4899:
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_38);
    }
    ::QVariant::~QVariant((QVariant *)&local_38);
    goto switchD_003f3c48_default;
  case 0x28:
    pvVar12 = _a[1];
    pvVar11 = _a[2];
    uVar8 = (ulong)*_a[3];
    pp_Var14 = _o->_vptr_QObject;
    goto LAB_003f4463;
  case 0x29:
    pvVar12 = _a[1];
    pvVar11 = _a[2];
    pp_Var14 = _o->_vptr_QObject;
    uVar8 = 2;
LAB_003f4463:
    iVar5 = (*pp_Var14[0x13])(_o,pvVar12,pvVar11,uVar8);
    uVar4 = (undefined1)iVar5;
    goto LAB_003f497d;
  case 0x2a:
    uVar1 = *_a[1];
    uVar2 = *_a[2];
    uVar8 = (ulong)*_a[3];
    pp_Var14 = _o->_vptr_QObject;
    goto LAB_003f4792;
  case 0x2b:
    uVar1 = *_a[1];
    uVar2 = *_a[2];
    pp_Var14 = _o->_vptr_QObject;
    uVar8 = 0;
LAB_003f4792:
    uStack_1c = 0xaaaaaaaa;
    uStack_20 = 0xaaaaaaaa;
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    (*pp_Var14[0x14])(&local_38,_o,(ulong)uVar1,(ulong)uVar2,uVar8);
    goto LAB_003f4899;
  case 0x2c:
    uVar2 = *_a[1];
    uVar1 = *_a[2];
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[3];
    goto LAB_003f46a1;
  case 0x2d:
    uVar2 = *_a[1];
    uVar1 = *_a[2];
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f46a1:
    uVar8 = (ulong)uVar1;
    pp_Var14 = _o->_vptr_QObject;
LAB_003f48ff:
    iVar5 = (*pp_Var14[0x1f])(_o,(ulong)uVar2,uVar8,paVar9);
    uVar4 = (undefined1)iVar5;
    goto LAB_003f497d;
  case 0x2e:
    uVar2 = *_a[1];
    uVar1 = *_a[2];
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[3];
    goto LAB_003f4945;
  case 0x2f:
    uVar2 = *_a[1];
    uVar1 = *_a[2];
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f4945:
    uVar8 = (ulong)uVar1;
    pp_Var14 = _o->_vptr_QObject;
LAB_003f4948:
    iVar5 = (*pp_Var14[0x20])(_o,(ulong)uVar2,uVar8,paVar9);
    uVar4 = (undefined1)iVar5;
    goto LAB_003f497d;
  case 0x30:
    uVar2 = *_a[1];
    uVar1 = *_a[2];
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[3];
    goto LAB_003f41dd;
  case 0x31:
    uVar2 = *_a[1];
    uVar1 = *_a[2];
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f41dd:
    uVar8 = (ulong)uVar1;
    pp_Var14 = _o->_vptr_QObject;
LAB_003f47ba:
    iVar5 = (*pp_Var14[0x21])(_o,(ulong)uVar2,uVar8,paVar9);
    uVar4 = (undefined1)iVar5;
    goto LAB_003f497d;
  case 0x32:
    uVar2 = *_a[1];
    uVar1 = *_a[2];
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[3];
    goto LAB_003f4970;
  case 0x33:
    uVar2 = *_a[1];
    uVar1 = *_a[2];
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f4970:
    uVar8 = (ulong)uVar1;
    pp_Var14 = _o->_vptr_QObject;
LAB_003f4973:
    iVar5 = (*pp_Var14[0x22])(_o,(ulong)uVar2,uVar8,paVar9);
    uVar4 = (undefined1)iVar5;
    goto LAB_003f497d;
  case 0x34:
    pvVar12 = _a[1];
    uVar1 = *_a[2];
    uVar8 = (ulong)*_a[3];
    pvVar11 = _a[4];
    uVar2 = *_a[5];
    pp_Var14 = _o->_vptr_QObject;
    goto LAB_003f4929;
  case 0x35:
    pvVar12 = _a[1];
    uVar2 = *_a[2];
    uVar8 = (ulong)*_a[3];
    pvVar11 = _a[4];
    uVar1 = *_a[5];
    pp_Var14 = _o->_vptr_QObject;
    goto LAB_003f436d;
  case 0x36:
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[2];
    uVar2 = *_a[1];
    goto LAB_003f48f9;
  case 0x37:
    uVar2 = *_a[1];
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f48f9:
    pp_Var14 = _o->_vptr_QObject;
    uVar8 = 1;
    goto LAB_003f48ff;
  case 0x38:
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[2];
    uVar2 = *_a[1];
    goto LAB_003f475b;
  case 0x39:
    uVar2 = *_a[1];
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f475b:
    pp_Var14 = _o->_vptr_QObject;
    uVar8 = 1;
    goto LAB_003f4948;
  case 0x3a:
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[2];
    uVar2 = *_a[1];
    goto LAB_003f47b4;
  case 0x3b:
    uVar2 = *_a[1];
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f47b4:
    pp_Var14 = _o->_vptr_QObject;
    uVar8 = 1;
    goto LAB_003f47ba;
  case 0x3c:
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[2];
    uVar2 = *_a[1];
    goto LAB_003f44c4;
  case 0x3d:
    uVar2 = *_a[1];
    paVar9 = &local_38;
    local_38._forAlignment = -NAN;
    local_38._8_8_ = (undefined1 *)0x0;
    local_38._16_8_ = (undefined1 *)0x0;
LAB_003f44c4:
    pp_Var14 = _o->_vptr_QObject;
    uVar8 = 1;
    goto LAB_003f4973;
  case 0x3e:
    pvVar12 = _a[1];
    uVar1 = *_a[2];
    pvVar11 = _a[3];
    uVar2 = *_a[4];
    pp_Var14 = _o->_vptr_QObject;
    uVar8 = 1;
LAB_003f4929:
    iVar5 = (*pp_Var14[0x23])(_o,pvVar12,(ulong)uVar1,uVar8,pvVar11,(ulong)uVar2);
    uVar4 = (undefined1)iVar5;
    goto LAB_003f497d;
  case 0x3f:
    pvVar12 = _a[1];
    uVar2 = *_a[2];
    pvVar11 = _a[3];
    uVar1 = *_a[4];
    pp_Var14 = _o->_vptr_QObject;
    uVar8 = 1;
LAB_003f436d:
    iVar5 = (*pp_Var14[0x24])(_o,pvVar12,(ulong)uVar2,uVar8,pvVar11,(ulong)uVar1);
    uVar4 = (undefined1)iVar5;
    goto LAB_003f497d;
  case 0x40:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      (*_o->_vptr_QObject[0x25])(_o,_a[1],*(long *)(in_FS_OFFSET + 0x28),_o->_vptr_QObject[0x25]);
      return;
    }
    break;
  case 0x41:
    iVar5 = (*_o->_vptr_QObject[0x26])(_o,_a[1]);
    uVar4 = (undefined1)iVar5;
LAB_003f497d:
    if ((undefined1 *)*_a != (undefined1 *)0x0) {
      *(undefined1 *)*_a = uVar4;
    }
switchD_003f3c48_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    break;
  case 0x42:
    iVar5 = (*_o->_vptr_QObject[0x27])(_o,_a[1]);
    goto LAB_003f4672;
  case 0x43:
    uVar2 = *_a[1];
    uVar8 = (ulong)*_a[2];
    UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x28];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
LAB_003f49c2:
      (*UNRECOVERED_JUMPTABLE_00)(_o,(ulong)uVar2,uVar8,UNRECOVERED_JUMPTABLE_00);
      return;
    }
    break;
  case 0x44:
    uVar2 = *_a[1];
    UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x28];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      uVar8 = 0;
      goto LAB_003f49c2;
    }
    break;
  case 0x45:
    pvVar12 = _a[1];
    uVar7 = (ulong)*_a[2];
    pvVar11 = _a[3];
    uVar8 = (ulong)*_a[4];
    uVar15 = *_a[5];
    pp_Var14 = _o->_vptr_QObject;
    goto LAB_003f4050;
  case 0x46:
    pvVar12 = _a[1];
    uVar7 = (ulong)*_a[2];
    pvVar11 = _a[3];
    uVar8 = (ulong)*_a[4];
    pp_Var14 = _o->_vptr_QObject;
    uVar15 = 0x22;
    goto LAB_003f4050;
  case 0x47:
    pvVar12 = _a[1];
    uVar7 = (ulong)*_a[2];
    pvVar11 = _a[3];
    pp_Var14 = _o->_vptr_QObject;
    uVar15 = 0x22;
    uVar8 = 1;
LAB_003f4050:
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*pp_Var14[0x2a])(&local_38,_o,pvVar12,uVar7,pvVar11,uVar8,uVar15);
    if ((QArrayDataPointer<QModelIndex> *)*_a != (QArrayDataPointer<QModelIndex> *)0x0) {
      QArrayDataPointer<QModelIndex>::operator=
                ((QArrayDataPointer<QModelIndex> *)*_a,(QArrayDataPointer<QModelIndex> *)&local_38);
    }
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_38);
  default:
    goto switchD_003f3c48_default;
  }
LAB_003f4a0b:
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        case 1: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 2: _t->headerDataChanged((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 3: _t->layoutChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemModel::LayoutChangeHint>>(_a[2]))); break;
        case 4: _t->layoutChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1]))); break;
        case 5: _t->layoutChanged(); break;
        case 6: _t->layoutAboutToBeChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemModel::LayoutChangeHint>>(_a[2]))); break;
        case 7: _t->layoutAboutToBeChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1]))); break;
        case 8: _t->layoutAboutToBeChanged(); break;
        case 9: _t->rowsAboutToBeInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 10: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 11: _t->rowsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 12: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 13: _t->columnsAboutToBeInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 14: _t->columnsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 15: _t->columnsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 16: _t->columnsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 17: _t->modelAboutToBeReset(QPrivateSignal()); break;
        case 18: _t->modelReset(QPrivateSignal()); break;
        case 19: _t->rowsAboutToBeMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 20: _t->rowsMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 21: _t->columnsAboutToBeMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 22: _t->columnsMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 23: { bool _r = _t->submit();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 24: _t->revert(); break;
        case 25: _t->resetInternalData(); break;
        case 26: { bool _r = _t->hasIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 27: { bool _r = _t->hasIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 28: { QModelIndex _r = _t->index((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 29: { QModelIndex _r = _t->index((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 30: { QModelIndex _r = _t->parent((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 31: { QModelIndex _r = _t->sibling((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 32: { int _r = _t->rowCount((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 33: { int _r = _t->rowCount();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 34: { int _r = _t->columnCount((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 35: { int _r = _t->columnCount();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 36: { bool _r = _t->hasChildren((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 37: { bool _r = _t->hasChildren();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 38: { QVariant _r = _t->data((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 39: { QVariant _r = _t->data((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 40: { bool _r = _t->setData((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 41: { bool _r = _t->setData((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 42: { QVariant _r = _t->headerData((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 43: { QVariant _r = _t->headerData((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 44: { bool _r = _t->insertRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 45: { bool _r = _t->insertRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 46: { bool _r = _t->insertColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 47: { bool _r = _t->insertColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 48: { bool _r = _t->removeRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 49: { bool _r = _t->removeRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 50: { bool _r = _t->removeColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 51: { bool _r = _t->removeColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 52: { bool _r = _t->moveRows((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 53: { bool _r = _t->moveColumns((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 54: { bool _r = _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 55: { bool _r = _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 56: { bool _r = _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 57: { bool _r = _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 58: { bool _r = _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 59: { bool _r = _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 60: { bool _r = _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 61: { bool _r = _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 62: { bool _r = _t->moveRow((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 63: { bool _r = _t->moveColumn((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 64: _t->fetchMore((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 65: { bool _r = _t->canFetchMore((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 66: { Qt::ItemFlags _r = _t->flags((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< Qt::ItemFlags*>(_a[0]) = std::move(_r); }  break;
        case 67: _t->sort((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 68: _t->sort((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 69: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<Qt::MatchFlags>>(_a[5])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 70: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 71: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , const QModelIndex & , const QList<int> & )>(_a, &QAbstractItemModel::dataChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(Qt::Orientation , int , int )>(_a, &QAbstractItemModel::headerDataChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QList<QPersistentModelIndex> & , QAbstractItemModel::LayoutChangeHint )>(_a, &QAbstractItemModel::layoutChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QList<QPersistentModelIndex> & , QAbstractItemModel::LayoutChangeHint )>(_a, &QAbstractItemModel::layoutAboutToBeChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeInserted, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsInserted, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeRemoved, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsRemoved, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeInserted, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsInserted, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeRemoved, 15))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsRemoved, 16))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(QPrivateSignal)>(_a, &QAbstractItemModel::modelAboutToBeReset, 17))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(QPrivateSignal)>(_a, &QAbstractItemModel::modelReset, 18))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeMoved, 19))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsMoved, 20))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeMoved, 21))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsMoved, 22))
            return;
    }
}